

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.cpp
# Opt level: O2

tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *
Kernel::toNumeralMul
          (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
           *__return_storage_ptr__,TermList t)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  TermList TVar4;
  TermList TVar5;
  ulong uVar6;
  RationalConstantType *this;
  RationalConstantType *this_00;
  RationalConstantType local_188;
  Option<Kernel::TermList> local_168;
  tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> local_158;
  RationalConstantType local_128;
  OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_> local_108;
  RationalConstantType *local_d0;
  IntegerConstantType *local_c8;
  mp_limb_t *pmStack_c0;
  OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_> local_a8;
  OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_> local_68;
  
  this = &local_188;
  this_00 = &local_188;
  if ((t._content & 1) != 0) {
    local_a8._isSome = true;
    local_a8._elem._elem._0_8_ = t._content;
    rat((RationalConstantType *)&local_108,1);
    std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
    _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
              ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
               __return_storage_ptr__,(Option<Kernel::TermList> *)&local_a8,
               (RationalConstantType *)&local_108);
    RationalConstantType::~RationalConstantType((RationalConstantType *)&local_108);
    return __return_storage_ptr__;
  }
  uVar1 = *(uint *)(t._content + 8);
  TVar4 = SortHelper::getResultSort(t._content);
  TVar5 = AtomicSort::intSort();
  if (TVar4._content == TVar5._content) {
    uVar3 = NumTraits<Kernel::IntegerConstantType>::mulF();
    if ((uVar1 == uVar3) &&
       (bVar2 = NumTraits<Kernel::IntegerConstantType>::isNumeral<Kernel::TermList>
                          ((TermList)
                           *(uint64_t *)
                            (t._content + 0x28 +
                            (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8)), bVar2)) {
      uVar6 = (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff);
      local_188._num._val[0]._mp_alloc._0_1_ = 1;
      local_188._num._val[0]._mp_d = *(mp_limb_t **)(t._content + 0x20 + uVar6 * 8);
      NumTraits<Kernel::IntegerConstantType>::tryNumeral
                ((NumTraits<Kernel::IntegerConstantType> *)&local_c8,
                 (TermList)*(uint64_t *)(t._content + 0x28 + uVar6 * 8));
      IntegerConstantType::IntegerConstantType(&local_128._num,local_c8);
      rat((RationalConstantType *)&local_158,&local_128._num);
      std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
      _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
                ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
                 &local_108,(Option<Kernel::TermList> *)&local_188,
                 (RationalConstantType *)&local_158);
      Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
      OptionBase(&local_a8,
                 (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)&local_108);
    }
    else {
      bVar2 = NumTraits<Kernel::IntegerConstantType>::isNumeral<Kernel::TermList>(t);
      if (!bVar2) {
        local_188._num._val[0]._mp_alloc._0_1_ = 1;
        local_188._num._val[0]._mp_d = (mp_limb_t *)t._content;
        RationalConstantType::RationalConstantType((RationalConstantType *)&local_158,1);
        std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
        _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
                  ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
                   &local_108,(Option<Kernel::TermList> *)&local_188,
                   (RationalConstantType *)&local_158);
        Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
        OptionBase(&local_a8,
                   (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)&local_108)
        ;
        RationalConstantType::~RationalConstantType((RationalConstantType *)&local_108);
        RationalConstantType::~RationalConstantType((RationalConstantType *)&local_158);
        goto LAB_00475dee;
      }
      local_188._num._val[0]._mp_alloc = 0;
      local_188._num._val[0]._mp_size = 0;
      local_188._num._val[0]._mp_d = (mp_limb_t *)0x0;
      NumTraits<Kernel::IntegerConstantType>::tryNumeral
                ((NumTraits<Kernel::IntegerConstantType> *)&local_c8,t);
      IntegerConstantType::IntegerConstantType(&local_128._num,local_c8);
      rat((RationalConstantType *)&local_158,&local_128._num);
      std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
      _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
                ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
                 &local_108,(Option<Kernel::TermList> *)&local_188,
                 (RationalConstantType *)&local_158);
      Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
      OptionBase(&local_a8,
                 (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)&local_108);
    }
    RationalConstantType::~RationalConstantType((RationalConstantType *)&local_108);
    RationalConstantType::~RationalConstantType((RationalConstantType *)&local_158);
    IntegerConstantType::~IntegerConstantType(&local_128._num);
  }
  else {
    local_a8._elem._elem.init.
    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
    super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den._val[0]._mp_d =
         (mp_limb_t *)0x0;
    local_a8._elem._elem._32_8_ = 0;
    local_a8._elem._elem.init.
    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
    super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._num._val[0]._mp_d =
         (mp_limb_t *)0x0;
    local_a8._elem._elem._16_8_ = 0;
    local_a8._isSome = false;
    local_a8._1_7_ = 0;
    local_a8._elem._elem._0_8_ = 0;
    local_a8._elem._elem.init.
    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
    super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
    super_OptionBase<Kernel::TermList>._elem._elem = (MaybeUninit<Kernel::TermList>)(Value)0x0;
  }
LAB_00475dee:
  if (local_a8._isSome == true) {
    Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
    OptionBase(&local_108,&local_a8);
    goto LAB_00475fb1;
  }
  TVar5 = AtomicSort::rationalSort();
  if (TVar4._content != TVar5._content) {
    local_108._elem._elem.init.
    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
    super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den._val[0]._mp_d =
         (mp_limb_t *)0x0;
    local_108._elem._elem._32_8_ = 0;
    local_108._elem._elem.init.
    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
    super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._num._val[0]._mp_d =
         (mp_limb_t *)0x0;
    local_108._elem._elem._16_8_ = 0;
    local_108._isSome = false;
    local_108._1_7_ = 0;
    local_108._elem._elem._0_8_ = 0;
    local_108._elem._elem.init.
    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
    super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
    super_OptionBase<Kernel::TermList>._elem._elem = (MaybeUninit<Kernel::TermList>)(Value)0x0;
    goto LAB_00475fb1;
  }
  uVar3 = NumTraits<Kernel::RationalConstantType>::mulF();
  if ((uVar1 == uVar3) &&
     (bVar2 = NumTraits<Kernel::RationalConstantType>::isNumeral<Kernel::TermList>
                        ((TermList)
                         *(uint64_t *)
                          (t._content + 0x28 + (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8)
                        ), bVar2)) {
    uVar6 = (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff);
    local_c8 = (IntegerConstantType *)CONCAT71(local_c8._1_7_,1);
    pmStack_c0 = *(mp_limb_t **)(t._content + 0x20 + uVar6 * 8);
    NumTraits<Kernel::RationalConstantType>::tryNumeral
              ((NumTraits<Kernel::RationalConstantType> *)&local_168,
               (TermList)*(uint64_t *)(t._content + 0x28 + uVar6 * 8));
    RationalConstantType::RationalConstantType
              (&local_128,(RationalConstantType *)local_168.super_OptionBase<Kernel::TermList>._0_8_
              );
    RationalConstantType::RationalConstantType(&local_188,&local_128);
    std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
    _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
              ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
               &local_158,(Option<Kernel::TermList> *)&local_c8,&local_188);
    Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
    OptionBase(&local_108,&local_158);
LAB_00475f4d:
    RationalConstantType::~RationalConstantType((RationalConstantType *)&local_158);
    RationalConstantType::~RationalConstantType(&local_188);
    this = &local_128;
  }
  else {
    bVar2 = NumTraits<Kernel::RationalConstantType>::isNumeral<Kernel::TermList>(t);
    if (bVar2) {
      local_c8 = (IntegerConstantType *)0x0;
      pmStack_c0 = (mp_limb_t *)0x0;
      NumTraits<Kernel::RationalConstantType>::tryNumeral
                ((NumTraits<Kernel::RationalConstantType> *)&local_168,t);
      RationalConstantType::RationalConstantType
                (&local_128,
                 (RationalConstantType *)local_168.super_OptionBase<Kernel::TermList>._0_8_);
      RationalConstantType::RationalConstantType(&local_188,&local_128);
      std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
      _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
                ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
                 &local_158,(Option<Kernel::TermList> *)&local_c8,&local_188);
      Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
      OptionBase(&local_108,&local_158);
      goto LAB_00475f4d;
    }
    local_128._num._val[0]._mp_alloc._0_1_ = 1;
    local_128._num._val[0]._mp_d = (mp_limb_t *)t._content;
    RationalConstantType::RationalConstantType(&local_188,1);
    std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
    _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
              ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
               &local_158,(Option<Kernel::TermList> *)&local_128,&local_188);
    Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
    OptionBase(&local_108,&local_158);
    RationalConstantType::~RationalConstantType((RationalConstantType *)&local_158);
  }
  RationalConstantType::~RationalConstantType(this);
LAB_00475fb1:
  if (local_108._isSome == true) {
    Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
    OptionBase(&local_68,&local_108);
  }
  else {
    TVar5 = AtomicSort::realSort();
    if (TVar4._content == TVar5._content) {
      uVar3 = NumTraits<Kernel::RealConstantType>::mulF();
      if ((uVar1 == uVar3) &&
         (bVar2 = NumTraits<Kernel::RealConstantType>::isNumeral<Kernel::TermList>
                            ((TermList)
                             *(uint64_t *)
                              (t._content + 0x28 +
                              (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8)), bVar2)) {
        uVar6 = (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff);
        local_168.super_OptionBase<Kernel::TermList>._isSome = true;
        local_168.super_OptionBase<Kernel::TermList>._elem._elem =
             *(Value *)(t._content + 0x20 + uVar6 * 8);
        NumTraits<Kernel::RealConstantType>::tryNumeral
                  ((NumTraits<Kernel::RealConstantType> *)&local_d0,
                   (TermList)*(uint64_t *)(t._content + 0x28 + uVar6 * 8));
        RationalConstantType::RationalConstantType(&local_128,local_d0);
        RationalConstantType::RationalConstantType(&local_188,&local_128);
        std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
        _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
                  ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
                   &local_158,&local_168,&local_188);
        Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
        OptionBase(&local_68,&local_158);
        RationalConstantType::~RationalConstantType((RationalConstantType *)&local_158);
        RationalConstantType::~RationalConstantType(&local_188);
        this_00 = &local_128;
      }
      else {
        bVar2 = NumTraits<Kernel::RealConstantType>::isNumeral<Kernel::TermList>(t);
        if (bVar2) {
          local_168.super_OptionBase<Kernel::TermList>._0_8_ = (RationalConstantType *)0x0;
          local_168.super_OptionBase<Kernel::TermList>._elem._elem = (Value)0x0;
          NumTraits<Kernel::RealConstantType>::tryNumeral
                    ((NumTraits<Kernel::RealConstantType> *)&local_d0,t);
          RationalConstantType::RationalConstantType((RationalConstantType *)&local_c8,local_d0);
          RationalConstantType::RationalConstantType(&local_188,(RationalConstantType *)&local_c8);
          std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
          _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
                    ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
                     &local_158,&local_168,&local_188);
          Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
          ::OptionBase(&local_68,&local_158);
          RationalConstantType::~RationalConstantType((RationalConstantType *)&local_158);
          RationalConstantType::~RationalConstantType(&local_188);
          this_00 = (RationalConstantType *)&local_c8;
        }
        else {
          local_168.super_OptionBase<Kernel::TermList>._isSome = true;
          local_168.super_OptionBase<Kernel::TermList>._elem._elem = (Value)t._content;
          RationalConstantType::RationalConstantType(&local_188,1);
          std::_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>::
          _Tuple_impl<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType,void>
                    ((_Tuple_impl<0ul,Lib::Option<Kernel::TermList>,Kernel::RationalConstantType> *)
                     &local_158,&local_168,&local_188);
          Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
          ::OptionBase(&local_68,&local_158);
          RationalConstantType::~RationalConstantType((RationalConstantType *)&local_158);
        }
      }
      RationalConstantType::~RationalConstantType(this_00);
    }
    else {
      local_68._elem._elem.init.
      super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
      super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
      super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den._val[0]._mp_d =
           (mp_limb_t *)0x0;
      local_68._elem._elem._32_8_ = 0;
      local_68._elem._elem.init.
      super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
      super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
      super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._num._val[0]._mp_d =
           (mp_limb_t *)0x0;
      local_68._elem._elem._16_8_ = 0;
      local_68._isSome = false;
      local_68._1_7_ = 0;
      local_68._elem._elem._0_8_ = 0;
      local_68._elem._elem.init.
      super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
      super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
      super_OptionBase<Kernel::TermList>._elem._elem = (MaybeUninit<Kernel::TermList>)(Value)0x0;
    }
  }
  Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
  ~OptionBase(&local_108);
  Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
  ~OptionBase(&local_a8);
  std::_Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>::_Tuple_impl
            (&__return_storage_ptr__->
              super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>,
             (_Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)
             &local_68._elem);
  Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
  ~OptionBase(&local_68);
  return __return_storage_ptr__;
}

Assistant:

auto toNumeralMul(TermList t) -> std::tuple<Option<TermList>, RationalConstantType> {
  if (t.isVar()) {
    return std::make_tuple(Option<TermList>(t), rat(1));
  } else {
    auto term = t.term();
    auto f = term->functor();
    auto sort = SortHelper::getResultSort(term);
    return tryNumTraits([&](auto numTraits) {
        if (sort != numTraits.sort()) {
          return Option<std::tuple<Option<TermList>, RationalConstantType>>();

        } else if (f == numTraits.mulF() && numTraits.isNumeral(*term->nthArgument(0))) {
          /* t = k * t' ( for some numeral k ) */
          return some(std::make_tuple(
                some(*term->nthArgument(1)),  /* <- t' */
                rat(numTraits.tryNumeral(*term->nthArgument(0)).unwrap()) /* <- k */
                ));

        } else if (numTraits.isNumeral(t)) {
          /* t is a numeral */
          return some(std::make_tuple(
                Option<TermList>(), 
                rat(numTraits.tryNumeral(t).unwrap())
                ));

        } else {
          /* t is uninterpreted */
          return some(std::make_tuple(Option<TermList>(t), RationalConstantType(1)));
        }
    }).unwrap();
  }
}